

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O0

char * mp_encode_double(char *data,double num)

{
  char *pcVar1;
  double num_local;
  char *data_local;
  
  pcVar1 = mp_store_u8(data,0xcb);
  pcVar1 = mp_store_double(pcVar1,num);
  return pcVar1;
}

Assistant:

MP_IMPL char *
mp_encode_double(char *data, double num)
{
	data = mp_store_u8(data, 0xcb);
	return mp_store_double(data, num);
}